

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O0

bool __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t *node_id,uint64_t symb)

{
  uint64_t x;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong i_00;
  ulong *in_RSI;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_RDI;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  compact_vector *in_stack_00000010;
  uint64_t i;
  uint64_t key;
  uint64_t in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc8;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffffd0;
  ulong uVar3;
  
  x = make_key_(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(uint64_t)in_RDI);
  uVar1 = hash::vigna_hasher::hash(x);
  uVar2 = size_p2::mask(&in_RDI->capa_size_);
  i_00 = uVar1 & uVar2;
  do {
    if ((i_00 != 0) &&
       (uVar3 = i_00, uVar1 = get_root(in_RDI), in_stack_ffffffffffffffb8 = i_00, i_00 != uVar1)) {
      uVar1 = compact_vector::operator[](&in_RDI->table_,i_00);
      if (uVar1 == 0) {
        if (in_RDI->size_ == in_RDI->max_size_) {
          return false;
        }
        compact_vector::set(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        in_RDI->size_ = in_RDI->size_ + 1;
        *in_RSI = uVar3;
        return true;
      }
      uVar1 = compact_vector::operator[](&in_RDI->table_,i_00);
      in_stack_ffffffffffffffb8 = i_00;
      if (uVar1 == x) {
        *in_RSI = uVar3;
        return false;
      }
    }
    i_00 = right_(in_RDI,in_stack_ffffffffffffffb8);
  } while( true );
}

Assistant:

bool add_child(uint64_t& node_id, uint64_t symb) {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that any table_[i] = 0 indicates to be empty.
                continue;
            }

            if (i == get_root()) {
                continue;
            }

            if (table_[i] == 0) {
                // this slot is empty
                if (size_ == max_size_) {
                    return false;  // needs to expand
                }

                table_.set(i, key);

                ++size_;
                node_id = i;

                return true;
            }

            if (table_[i] == key) {
                node_id = i;
                return false;  // already stored
            }
        }
    }